

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_12::VersionEditPrinter
          (anon_unknown_12 *this,uint64_t pos,Slice record,WritableFile *dst)

{
  bool bVar1;
  Slice local_158;
  Status local_148;
  undefined1 local_140 [32];
  Status local_120 [4];
  undefined1 local_100 [8];
  Status s;
  VersionEdit edit;
  string local_48 [8];
  string r;
  WritableFile *dst_local;
  uint64_t pos_local;
  Slice record_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"--- offset ",
             (allocator *)
             ((long)&edit.new_files_.
                     super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&edit.new_files_.
                     super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  AppendNumberTo((string *)local_48,(uint64_t)this);
  std::__cxx11::string::operator+=(local_48,"; ");
  VersionEdit::VersionEdit((VersionEdit *)&s);
  VersionEdit::DecodeFrom((VersionEdit *)local_100,(Slice *)&s);
  bVar1 = Status::ok((Status *)local_100);
  if (bVar1) {
    VersionEdit::DebugString_abi_cxx11_((VersionEdit *)local_140);
    std::__cxx11::string::operator+=(local_48,(string *)local_140);
    std::__cxx11::string::~string((string *)local_140);
  }
  else {
    Status::ToString_abi_cxx11_(local_120);
    std::__cxx11::string::operator+=(local_48,(string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::push_back((char)local_48);
  }
  Slice::Slice(&local_158,(string *)local_48);
  (**(code **)(*(long *)record.size_ + 0x10))(&local_148,(long *)record.size_,&local_158);
  Status::~Status(&local_148);
  Status::~Status((Status *)local_100);
  VersionEdit::~VersionEdit((VersionEdit *)&s);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

static void VersionEditPrinter(uint64_t pos, Slice record, WritableFile* dst) {
  std::string r = "--- offset ";
  AppendNumberTo(&r, pos);
  r += "; ";
  VersionEdit edit;
  Status s = edit.DecodeFrom(record);
  if (!s.ok()) {
    r += s.ToString();
    r.push_back('\n');
  } else {
    r += edit.DebugString();
  }
  dst->Append(r);
}